

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void Assimp::FBX::Node::WritePropertyNodeBinary
               (string *name,vector<int,_std::allocator<int>_> *v,StreamWriterLE *s)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  reference piVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  const_iterator it;
  undefined1 local_90 [8];
  Node node;
  StreamWriterLE *s_local;
  vector<int,_std::allocator<int>_> *v_local;
  string *name_local;
  
  node.property_start = (size_t)s;
  Node((Node *)local_90,name);
  BeginBinary((Node *)local_90,(StreamWriterLE *)node.property_start);
  StreamWriter<false,_false>::PutU1((StreamWriter<false,_false> *)node.property_start,'i');
  sVar1 = node.property_start;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(v);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)sVar1,(uint32_t)sVar3);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)node.property_start,0);
  sVar1 = node.property_start;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(v);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)sVar1,(int)sVar3 << 2);
  local_a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(v);
  while( true ) {
    local_b0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(v);
    bVar2 = __gnu_cxx::operator!=(&local_a8,&local_b0);
    sVar1 = node.property_start;
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_a8);
    StreamWriter<false,_false>::PutI4((StreamWriter<false,_false> *)sVar1,*piVar4);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_a8);
  }
  EndPropertiesBinary((Node *)local_90,(StreamWriterLE *)node.property_start,1);
  EndBinary((Node *)local_90,(StreamWriterLE *)node.property_start,false);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void FBX::Node::WritePropertyNodeBinary(
    const std::string& name,
    const std::vector<int32_t>& v,
    Assimp::StreamWriterLE& s
){
    FBX::Node node(name);
    node.BeginBinary(s);
    s.PutU1('i');
    s.PutU4(uint32_t(v.size())); // number of elements
    s.PutU4(0); // no encoding (1 would be zip-compressed)
    s.PutU4(uint32_t(v.size()) * 4); // data size
    for (auto it = v.begin(); it != v.end(); ++it) { s.PutI4(*it); }
    node.EndPropertiesBinary(s, 1);
    node.EndBinary(s, false);
}